

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_yield_arm(CPUARMState *env)

{
  CPUState *cpu;
  CPUState *cs;
  CPUARMState *env_local;
  
  cpu = env_cpu(env);
  cpu->exception_index = 0x10004;
  cpu_loop_exit_arm(cpu);
}

Assistant:

void HELPER(yield)(CPUARMState *env)
{
    CPUState *cs = env_cpu(env);

    /* This is a non-trappable hint instruction that generally indicates
     * that the guest is currently busy-looping. Yield control back to the
     * top level loop so that a more deserving VCPU has a chance to run.
     */
    cs->exception_index = EXCP_YIELD;
    cpu_loop_exit(cs);
}